

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iuutil::CmpHelperNeIterator<int*,int*>
          (AssertionResult *__return_storage_ptr__,iuutil *this,int *b1,int *e1,int *b2,int *e2)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  AssertionResult *rhs;
  Message ar;
  AssertionResult local_208;
  AssertionResult local_1e0;
  iuStreamMessage local_1b8;
  
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
  bVar1 = 0;
  for (; (this != (iuutil *)b1 && (e1 != b2)); e1 = e1 + 1) {
    iutest::internal::CmpHelperNE<int,int>(&local_1e0,(internal *)0x16f26a,"",(char *)this,e1,e2);
    iutest::AssertionResult::operator!(&local_208,&local_1e0);
    bVar2 = local_208.m_result;
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e0);
    bVar3 = 1;
    if (bVar2 == true) {
      iutest::PrintToString<int>(&local_208.m_message,(int *)this);
      iutest::detail::iuStreamMessage::operator<<(&local_1b8,&local_208.m_message);
      std::__cxx11::string::~string((string *)&local_208);
      bVar3 = bVar1;
    }
    bVar1 = bVar3;
    this = this + 4;
  }
  if ((bool)((this != (iuutil *)b1 || e1 != b2) | bVar1)) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_208.m_message._M_dataplus._M_p = (pointer)&local_208.m_message.field_2;
    local_208.m_message._M_string_length = 0;
    local_208.m_message.field_2._M_local_buf[0] = '\0';
    local_208.m_result = false;
    rhs = iutest::AssertionResult::operator<<(&local_208,&local_1b8);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_208);
  }
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNeIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = false;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::NeHelper<false>::Compare("", "", *b1, *b2))
        {
            ar << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2);
        }
        else
        {
            result = true;
        }
    }
    if( (b1 != e1) || (b2 != e2) )
    {
        result = true;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}